

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferVariableArrayCases<(deqp::gles31::Functional::ProgramResourcePropFlags)4>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  TestNode *pTVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  deInt32 *pdVar4;
  bool extendedCases;
  SharedPtr sized;
  ProgramResourceQueryTestTarget queryTarget;
  SharedPtr local_48;
  ProgramResourceQueryTestTarget local_38;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_BUFFER_VARIABLE,4);
  if (*(char *)&parentStructure->m_ptr[1]._vptr_Node == '\x01') {
    extendedCases = ((parentStructure->m_ptr->m_enclosingNode).m_ptr)->m_type != TYPE_ARRAY_ELEMENT;
  }
  else {
    extendedCases = false;
  }
  if (extendedCases != false) {
    pTVar1 = (TestNode *)operator_new(0x78);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar1,context->m_testCtx,"non_array","Non-array target");
    pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
    pTVar1[1]._vptr_TestNode = (_func_int **)context;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar1,&local_38,1,false);
  }
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar2->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar3 = parentStructure->m_state;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar4 = *pdVar4 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 0xffffffff;
  local_48.m_state = (SharedPtrStateBase *)0x0;
  local_48.m_ptr = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_48.m_state = pSVar3;
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,context->m_testCtx,"sized","Sized target");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
  generateBufferVariableArraySizeSubCases
            (context,&local_48,(TestCaseGroup *)pTVar1,PROGRAMRESOURCEPROP_ARRAY_STRIDE,true,
             extendedCases);
  pdVar4 = &pSVar3->strongRefCount;
  LOCK();
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    local_48.m_ptr = (Node *)0x0;
    (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar4 = &(local_48.m_state)->weakRefCount;
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    if (local_48.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_48.m_state = (SharedPtrStateBase *)0x0;
  }
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar2->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar3 = parentStructure->m_state;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar4 = *pdVar4 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 0xfffffffe;
  local_48.m_state = (SharedPtrStateBase *)0x0;
  local_48.m_ptr = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_48.m_state = pSVar3;
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,context->m_testCtx,"unsized","Unsized target");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
  generateBufferVariableArraySizeSubCases
            (context,&local_48,(TestCaseGroup *)pTVar1,PROGRAMRESOURCEPROP_ARRAY_STRIDE,false,
             extendedCases);
  pdVar4 = &pSVar3->strongRefCount;
  LOCK();
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    local_48.m_ptr = (Node *)0x0;
    (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar4 = &(local_48.m_state)->weakRefCount;
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if ((*pdVar4 == 0) && (local_48.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  return;
}

Assistant:

static void generateBufferVariableArrayCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_BUFFER_VARIABLE, TargetProp);
	const bool								namedNonArrayBlock	= static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named && parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	// .non_array
	if (namedNonArrayBlock)
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "non_array", "Non-array target");
		targetGroup->addChild(blockGroup);

		generateVariableCases(context, parentStructure, blockGroup, queryTarget, 1, false);
	}

	// .sized
	{
		const ResourceDefinition::Node::SharedPtr	sized		(new ResourceDefinition::ArrayElement(parentStructure));
		tcu::TestCaseGroup* const					blockGroup	= new TestCaseGroup(context, "sized", "Sized target");
		targetGroup->addChild(blockGroup);

		generateBufferVariableArraySizeSubCases(context, sized, blockGroup, TargetProp, true, namedNonArrayBlock);
	}

	// .unsized
	{
		const ResourceDefinition::Node::SharedPtr	unsized		(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		tcu::TestCaseGroup* const					blockGroup	= new TestCaseGroup(context, "unsized", "Unsized target");
		targetGroup->addChild(blockGroup);

		generateBufferVariableArraySizeSubCases(context, unsized, blockGroup, TargetProp, false, namedNonArrayBlock);
	}
}